

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::write_decimal<__int128>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this,__int128 value)

{
  undefined1 n [16];
  int iVar1;
  checked_ptr<typename_buffer<char>::value_type> pcVar2;
  long in_RDX;
  undefined8 unaff_RBX;
  internal *in_RSI;
  undefined8 unaff_R12;
  long lVar3;
  bool bVar4;
  
  lVar3 = in_RDX;
  if (in_RDX < 0) {
    bVar4 = in_RSI != (internal *)0x0;
    in_RSI = (internal *)-(long)in_RSI;
    lVar3 = -(ulong)bVar4 - in_RDX;
  }
  n._8_8_ = unaff_R12;
  n._0_8_ = unaff_RBX;
  iVar1 = count_digits(in_RSI,(uint128_t)n);
  pcVar2 = reserve<duckdb_fmt::v6::internal::buffer<char>,_0>
                     (&this->out_,(long)iVar1 - (in_RDX >> 0x3f));
  if (in_RDX < 0) {
    *pcVar2 = '-';
    pcVar2 = pcVar2 + 1;
  }
  format_decimal<char,unsigned__int128,char*,duckdb_fmt::v6::internal::format_decimal<char,char*,unsigned__int128>(char*,unsigned__int128,int)::_lambda(char*)_1_>
            (pcVar2,in_RSI,lVar3,iVar1);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }